

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_options.cpp
# Opt level: O0

string * __thiscall
RandomizerOptions::goal_abi_cxx11_(string *__return_storage_ptr__,RandomizerOptions *this)

{
  char *__s;
  const_reference ppcVar1;
  allocator<char> local_19;
  RandomizerOptions *local_18;
  RandomizerOptions *this_local;
  
  local_18 = this;
  this_local = (RandomizerOptions *)__return_storage_ptr__;
  ppcVar1 = std::array<const_char_*,_3UL>::at(&GOALS_TABLE,(ulong)this->_goal);
  __s = *ppcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_19)
  ;
  std::allocator<char>::~allocator(&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string RandomizerOptions::goal() const
{
    return GOALS_TABLE.at(_goal);
}